

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  uint32_t flag;
  uint32_t uVar1;
  bool bVar2;
  State *pSVar3;
  uint flag_00;
  uint uVar4;
  uint uVar5;
  Workq *pWVar6;
  Workq *pWVar7;
  uint uVar8;
  bool ismatch;
  ostream local_1a8 [376];
  
  if (state < (State *)0x3) {
    if (state == (State *)0x0) {
      LogMessage::LogMessage
                ((LogMessage *)&ismatch,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                 ,0x3fe);
      std::operator<<(local_1a8,"NULL state in RunStateOnByte");
    }
    else {
      if (state == (State *)0x2) {
        return (State *)0x2;
      }
      if (state == (State *)0x1) {
        LogMessage::LogMessage
                  ((LogMessage *)&ismatch,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                   ,0x3fa);
        std::operator<<(local_1a8,"DeadState in RunStateOnByte");
      }
      else {
        LogMessage::LogMessage
                  ((LogMessage *)&ismatch,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                   ,0x401);
        std::operator<<(local_1a8,"Unexpected special state in RunStateOnByte");
      }
    }
    LogMessage::~LogMessage((LogMessage *)&ismatch);
    pSVar3 = (State *)0x0;
  }
  else {
    if (c == 0x100) {
      uVar5 = this->prog_->bytemap_range_;
    }
    else {
      uVar5 = (uint)this->prog_->bytemap_[c];
    }
    pSVar3 = (State *)(&state[1].inst_)[(int)uVar5];
    if (pSVar3 == (State *)0x0) {
      StateToWorkq(this,state,this->q0_);
      uVar5 = state->flag_;
      uVar8 = uVar5 & 0xff;
      uVar4 = uVar8 | 2;
      if (c != 10) {
        uVar4 = uVar8;
      }
      if (c == 0x100) {
        bVar2 = false;
        uVar4 = uVar4 | 10;
      }
      else {
        bVar2 = Prog::IsWordChar((uint8_t)c);
      }
      flag_00 = (uint)(c == 10);
      uVar4 = (uint)(byte)((uVar5 >> 9 & 1) == 0 ^ bVar2) * 0x10 + 0x10 | uVar4;
      pWVar7 = this->q0_;
      pWVar6 = this->q1_;
      if ((uVar5 >> 0x10 & ~uVar8 & uVar4) != 0) {
        RunWorkqOnEmptyString(this,pWVar7,pWVar6,uVar4);
        pWVar6 = this->q0_;
        pWVar7 = this->q1_;
        this->q0_ = pWVar7;
        this->q1_ = pWVar6;
      }
      ismatch = false;
      RunWorkqOnByte(this,pWVar7,pWVar6,c,flag_00,&ismatch);
      pWVar7 = this->q0_;
      pWVar6 = this->q1_;
      this->q0_ = pWVar6;
      this->q1_ = pWVar7;
      if (this->kind_ != kManyMatch) {
        pWVar7 = (Workq *)0x0;
      }
      uVar1 = flag_00 | 0x100;
      if (ismatch == false) {
        pWVar7 = (Workq *)0x0;
        uVar1 = flag_00;
      }
      flag = uVar1 + 0x200;
      if (bVar2 == false) {
        flag = uVar1;
      }
      pSVar3 = WorkqToCachedState(this,pWVar6,pWVar7,flag);
      if (c == 0x100) {
        uVar5 = this->prog_->bytemap_range_;
      }
      else {
        uVar5 = (uint)this->prog_->bytemap_[c];
      }
      (&state[1].inst_)[(int)uVar5] = (int *)pSVar3;
    }
  }
  return pSVar3;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  //mutex_.AssertHeld();

  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint32_t needflag = state->flag_ >> kFlagNeedShift;
  uint32_t beforeflag = state->flag_ & kFlagEmptyMask;
  uint32_t oldbeforeflag = beforeflag;
  uint32_t afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = c != kByteEndText && Prog::IsWordChar(static_cast<uint8_t>(c));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    using std::swap;
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch);
  using std::swap;
  swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint32_t flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  if (ismatch && kind_ == Prog::kManyMatch)
    ns = WorkqToCachedState(q0_, q1_, flag);
  else
    ns = WorkqToCachedState(q0_, NULL, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}